

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructions.c
# Opt level: O0

Expr let(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
        int argc)

{
  size_t key;
  _Bool _Var1;
  int iVar2;
  Expr *__ptr;
  Expr EVar3;
  Expr EVar4;
  Expr expr;
  Expr expr_00;
  Expr a;
  Expr expr_01;
  Expr b;
  Expr expr_02;
  Expr value_00;
  pContext local_80;
  Expr value;
  Expr name;
  Expr *list;
  int len;
  int i;
  pContext_conflict context;
  Expr *var_list;
  int var_cnt;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  Expr res;
  
  var_list._4_4_ = argc;
  _var_cnt = args;
  args_local = (Expr *)callContext;
  callContext_local = defContext;
  defContext_local = (pContext_conflict)exec;
  if (argc < 2) {
    printf("let: too few arguments\n");
    exit(1);
  }
  EVar3._4_4_ = 0;
  EVar3.type = args->type;
  EVar3.field_1.val_atom = (args->field_1).val_atom;
  _Var1 = is_pair(EVar3);
  if (!_Var1) {
    a._4_4_ = 0;
    a.type = _var_cnt->type;
    b._4_4_ = 0;
    b.type = *(uint *)&defContext_local[3].base;
    a.field_1.val_atom = (_var_cnt->field_1).val_atom;
    b.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)
                (anon_union_8_8_707b72ea_for_Expr_1)defContext_local[3].bindings;
    _Var1 = is_equal(a,b);
    if (!_Var1) {
      printf("let: first argument not a list\n");
      exit(1);
    }
  }
  expr._4_4_ = 0;
  expr.type = _var_cnt->type;
  expr.field_1.val_atom = (_var_cnt->field_1).val_atom;
  context = (pContext_conflict)get_list((pExecutor)defContext_local,expr,(int *)&var_list);
  _len = context_inherit((pContext)args_local);
  list._4_4_ = 0;
  while( true ) {
    if ((int)var_list <= list._4_4_) {
      free(context);
      EVar3 = exec_eval_array((pExecutor)defContext_local,_len,_var_cnt + 1,var_list._4_4_ + -1);
      res._0_8_ = EVar3.field_1;
      exec_local._0_4_ = EVar3.type;
      context_unlink(_len);
      EVar4._4_4_ = 0;
      EVar4.type = (ValueType)exec_local;
      EVar4.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)res._0_8_;
      return EVar4;
    }
    expr_00._4_4_ = 0;
    expr_00.type = (&context->gc_index)[(long)list._4_4_ * 4];
    expr_00.field_1.val_atom =
         ((anon_union_8_8_707b72ea_for_Expr_1 *)(&context->gc_index + (long)list._4_4_ * 4 + 2))->
         val_atom;
    __ptr = get_list((pExecutor)defContext_local,expr_00,(int *)&list);
    if (((int)list == 0) || (2 < (int)list)) break;
    expr_01._4_4_ = 0;
    expr_01.type = __ptr->type;
    expr_01.field_1.val_atom = (__ptr->field_1).val_atom;
    _Var1 = is_atom(expr_01);
    if (!_Var1) break;
    key = (__ptr->field_1).val_atom;
    if ((int)list == 1) {
      local_80 = defContext_local[3].base;
      value._0_8_ = defContext_local[3].bindings;
    }
    else {
      expr_02._4_4_ = 0;
      expr_02.type = __ptr[1].type;
      expr_02.field_1.val_atom = __ptr[1].field_1.val_atom;
      EVar3 = exec_eval((pExecutor)defContext_local,_len,expr_02);
      value._0_8_ = EVar3.field_1;
      local_80 = (pContext)(ulong)EVar3.type;
    }
    free(__ptr);
    value_00._0_8_ = (ulong)local_80 & 0xffffffff;
    value_00.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)value._0_8_;
    iVar2 = context_bind(_len,key,value_00);
    if (iVar2 == -1) {
      printf("let context_bind failed\n");
      exit(1);
    }
    list._4_4_ = list._4_4_ + 1;
  }
  printf("let: invalid initializer\n");
  exit(1);
}

Assistant:

BUILTIN_FUNC(let)
{
    if (argc < 2)
    {
        log("let: too few arguments");
        exit(1);
    }
    if (!is_pair(args[0]) && !is_equal(args[0], exec->nil))
    {
        log("let: first argument not a list");
        exit(1);
    }
    int var_cnt;
    Expr *var_list = get_list(exec, args[0], &var_cnt);

    pContext context = context_inherit(callContext);
    for (int i = 0; i < var_cnt; i++)
    {
        int len;
        Expr *list = get_list(exec, var_list[i], &len);
        if (len == 0 || len > 2 || !is_atom(list[0]))
        {
            log("let: invalid initializer");
            exit(1);
        }
        Expr name = list[0];
        Expr value;
        if (len == 1)
            value = exec->nil;
        else
            value = exec_eval(exec, context, list[1]);
        free(list);
        if (context_bind(context, name.val_atom, value) == MAP_FAILED)
        {
            log("let context_bind failed");
            exit(1);
        }
    }
    free(var_list);

    Expr res = exec_eval_array(exec, context, args + 1, argc - 1);
    context_unlink(context);

    return res;
}